

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_sampler_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  ulong uVar2;
  bool bVar3;
  SPIRCombinedImageSampler *pSVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  uint32_t id_00;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = (ulong)id;
  if ((uVar2 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar2].type == TypeCombinedImageSampler)) {
    pSVar4 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar1 + uVar2);
    id = (pSVar4->image).id;
    bVar3 = false;
  }
  else {
    bVar3 = true;
    pSVar4 = (SPIRCombinedImageSampler *)0x0;
  }
  CompilerGLSL::to_expression_abi_cxx11_(&local_b0,&this->super_CompilerGLSL,id,true);
  id_00 = 0;
  lVar5 = ::std::__cxx11::string::find((char)&local_b0,0x5b);
  if (bVar3) {
    if (lVar5 != -1) {
LAB_002a41bb:
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b0);
      ::std::__cxx11::string::substr((ulong)local_90,(ulong)&local_b0);
      if (id_00 == 0) {
        ::std::operator+(&local_70,&local_50,&this->sampler_name_suffix);
        plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90[0]);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar7) {
          lVar5 = plVar6[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_
                  (__return_storage_ptr__,&this->super_CompilerGLSL,id_00,true);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      goto LAB_002a42dd;
    }
  }
  else {
    id_00 = (pSVar4->sampler).id;
    if (lVar5 != -1) goto LAB_002a41bb;
    if (id_00 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_
                (__return_storage_ptr__,&this->super_CompilerGLSL,id_00,true);
      goto LAB_002a42dd;
    }
  }
  ::std::operator+(__return_storage_ptr__,&local_b0,&this->sampler_name_suffix);
LAB_002a42dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_sampler_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	uint32_t samp_id = 0;
	if (combined)
		samp_id = combined->sampler;

	if (index == string::npos)
		return samp_id ? to_expression(samp_id) : expr + sampler_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return samp_id ? to_expression(samp_id) : (image_expr + sampler_name_suffix + array_expr);
	}
}